

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  ImGuiViewportP **ppIVar2;
  ImGuiID *pIVar3;
  int *piVar4;
  ImGuiID IVar5;
  ImGuiShrinkWidthItem *pIVar6;
  ImVec2 IVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  ImGuiID IVar10;
  ImGuiID IVar11;
  ImGuiID IVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  ImGuiContext *pIVar18;
  ImGuiContext *pIVar19;
  undefined4 uVar20;
  bool bVar21;
  bool bVar22;
  int section_n;
  long lVar23;
  ImGuiTabItem *pIVar24;
  char *pcVar25;
  ImGuiWindow *tab;
  char *__dest;
  uint uVar26;
  long lVar27;
  ImGuiWindow *pIVar28;
  ImGuiWindow *pIVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  ImGuiTabItem *pIVar33;
  uint uVar34;
  ulong uVar35;
  ImGuiTabItem *pIVar36;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  long lVar40;
  int iVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec4 arrow_col;
  ImGuiID local_100;
  undefined8 local_f0;
  float local_e8 [3];
  uint uStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  undefined1 local_b8 [16];
  int local_a4 [2];
  float local_9c;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ImVec4 local_88;
  ImVec2 local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  ImVec4 local_58;
  undefined1 local_48 [16];
  
  pIVar19 = GImGui;
  tab_bar->WantLayout = false;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  stack0xffffffffffffff20 = 0;
  local_c8 = 0.0;
  uVar39 = (tab_bar->Tabs).Size;
  uVar37 = (ulong)uVar39;
  if ((int)uVar39 < 1) {
    bVar21 = false;
    uVar26 = 0;
  }
  else {
    lVar23 = 0;
    uVar35 = 0;
    uVar26 = 0;
    bVar21 = false;
    do {
      pIVar33 = (tab_bar->Tabs).Data;
      pIVar3 = (ImGuiID *)((long)&pIVar33->ID + lVar23);
      if ((*(int *)((long)&pIVar33->LastFrameVisible + lVar23) < tab_bar->PrevFrameVisible) ||
         ((&pIVar33->WantClose)[lVar23] == true)) {
        IVar5 = *pIVar3;
        if (tab_bar->VisibleTabId == IVar5) {
          tab_bar->VisibleTabId = 0;
        }
        if (tab_bar->SelectedTabId == IVar5) {
          tab_bar->SelectedTabId = 0;
        }
        if (tab_bar->NextSelectedTabId == IVar5) {
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else {
        uVar30 = (ulong)uVar26;
        if (uVar35 != uVar30) {
          if (((int)uVar26 < 0) || ((int)uVar37 <= (int)uVar26)) goto LAB_002bc4bd;
          IVar5 = *pIVar3;
          IVar8 = pIVar3[1];
          IVar9 = pIVar3[2];
          IVar10 = pIVar3[3];
          IVar11 = pIVar3[4];
          IVar12 = pIVar3[5];
          fVar44 = (float)pIVar3[6];
          fVar42 = (float)pIVar3[7];
          *(undefined1 (*) [16])((long)&pIVar33[uVar30].Offset + 3) =
               *(undefined1 (*) [16])((long)pIVar3 + 0x1b);
          piVar4 = &pIVar33[uVar30].LastFrameVisible;
          *piVar4 = IVar11;
          piVar4[1] = IVar12;
          piVar4[2] = (int)fVar44;
          piVar4[3] = (int)fVar42;
          pIVar33 = pIVar33 + uVar30;
          pIVar33->ID = IVar5;
          pIVar33->Flags = IVar8;
          *(ImGuiID *)&pIVar33->Window = IVar9;
          *(ImGuiID *)((long)&pIVar33->Window + 4) = IVar10;
        }
        if (((int)uVar26 < 0) || ((tab_bar->Tabs).Size <= (int)uVar26)) goto LAB_002bc4bd;
        pIVar33 = (tab_bar->Tabs).Data;
        pIVar33[uVar30].IndexDuringLayout = (ImS16)uVar26;
        uVar39 = pIVar33[uVar30].Flags;
        lVar40 = 0;
        if ((uVar39 & 0x40) == 0) {
          lVar40 = (ulong)((char)uVar39 < '\0') + 1;
        }
        if (0 < (int)uVar26) {
          if ((tab_bar->Tabs).Size < (int)uVar26) goto LAB_002bc4bd;
          bVar22 = bVar21;
          if ((pIVar33[uVar30 - 1].Flags & 0x40U) == 0) {
            bVar22 = true;
          }
          if ((uVar39 & 0x40) == 0) {
            bVar22 = bVar21;
          }
          bVar21 = bVar22;
          if ((pIVar33[uVar30 - 1].Flags & 0xc0U) == 0x80) {
            bVar21 = true;
          }
          if ((uVar39 & 0xc0) == 0x80) {
            bVar21 = bVar22;
          }
        }
        local_e8[lVar40 * 3] = (float)((int)local_e8[lVar40 * 3] + 1);
        uVar26 = uVar26 + 1;
      }
      uVar35 = uVar35 + 1;
      uVar39 = (tab_bar->Tabs).Size;
      uVar37 = (ulong)(int)uVar39;
      lVar23 = lVar23 + 0x30;
    } while ((long)uVar35 < (long)uVar37);
  }
  if (uVar39 != uVar26) {
    iVar31 = (tab_bar->Tabs).Capacity;
    if (iVar31 < (int)uVar26) {
      if (iVar31 == 0) {
        uVar39 = 8;
      }
      else {
        uVar39 = iVar31 / 2 + iVar31;
      }
      if ((int)uVar39 <= (int)uVar26) {
        uVar39 = uVar26;
      }
      if (iVar31 < (int)uVar39) {
        pIVar24 = (ImGuiTabItem *)MemAlloc((long)(int)uVar39 * 0x30);
        pIVar33 = (tab_bar->Tabs).Data;
        if (pIVar33 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar24,pIVar33,(long)(tab_bar->Tabs).Size * 0x30);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar24;
        (tab_bar->Tabs).Capacity = uVar39;
      }
    }
    (tab_bar->Tabs).Size = uVar26;
  }
  if (bVar21) {
    qsort((tab_bar->Tabs).Data,(long)(tab_bar->Tabs).Size,0x30,TabItemComparerBySection);
  }
  fVar43 = local_e8[0];
  fVar42 = 0.0;
  fVar44 = 0.0;
  iVar31 = (int)uStack_d0;
  if ((0 < (int)local_e8[0]) &&
     ((int)uStack_d0 + uStack_dc != 0 &&
      SCARRY4((int)uStack_d0,uStack_dc) == (int)((int)uStack_d0 + uStack_dc) < 0)) {
    fVar44 = (pIVar19->Style).ItemInnerSpacing.x;
  }
  stack0xffffffffffffff20 = CONCAT44(uStack_dc,fVar44);
  if (0 < (int)uStack_d0 && 0 < (int)uStack_dc) {
    fVar42 = (pIVar19->Style).ItemInnerSpacing.x;
  }
  local_d8 = CONCAT44(fVar42,(float)local_d8);
  local_100 = tab_bar->NextSelectedTabId;
  if (local_100 == 0) {
    local_100 = 0;
  }
  else {
    tab_bar->SelectedTabId = local_100;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar21 = TabBarProcessReorder(tab_bar);
    if ((bVar21) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      local_100 = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar18 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    local_f0 = GImGui->CurrentWindow;
    fVar44 = (GImGui->Style).FramePadding.y;
    fVar42 = GImGui->FontSize;
    local_b8._0_4_ = (local_f0->DC).CursorPos.x;
    local_b8._4_4_ = (local_f0->DC).CursorPos.y;
    fVar45 = (tab_bar->BarRect).Min.y;
    (local_f0->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar44;
    (local_f0->DC).CursorPos.y = fVar45;
    (tab_bar->BarRect).Min.x = fVar42 + fVar44 + (tab_bar->BarRect).Min.x;
    local_58.x = (pIVar18->Style).Colors[0].x;
    local_58.y = (pIVar18->Style).Colors[0].y;
    uVar13 = (pIVar18->Style).Colors[0].z;
    uVar14 = (pIVar18->Style).Colors[0].w;
    local_58.w = (float)uVar14 * 0.5;
    local_58.z = (float)uVar13;
    pIVar33 = (ImGuiTabItem *)0x0;
    PushStyleColor(0,&local_58);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    bVar21 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar21) {
      if ((tab_bar->Tabs).Size < 1) {
        pIVar33 = (ImGuiTabItem *)0x0;
      }
      else {
        lVar40 = 0;
        lVar23 = 0;
        pIVar33 = (ImGuiTabItem *)0x0;
        do {
          pIVar24 = (tab_bar->Tabs).Data;
          if ((*(byte *)((long)&pIVar24->Flags + lVar40 + 2) & 0x20) == 0) {
            pIVar24 = (ImGuiTabItem *)((long)&pIVar24->ID + lVar40);
            pcVar25 = ImGuiTabBar::GetTabName(tab_bar,pIVar24);
            local_88.x = 0.0;
            local_88.y = 0.0;
            bVar21 = Selectable(pcVar25,tab_bar->SelectedTabId == pIVar24->ID,0,(ImVec2 *)&local_88)
            ;
            if (bVar21) {
              pIVar33 = pIVar24;
            }
          }
          lVar23 = lVar23 + 1;
          lVar40 = lVar40 + 0x30;
        } while (lVar23 < (tab_bar->Tabs).Size);
      }
      EndPopup();
    }
    auVar17 = local_b8;
    (local_f0->DC).CursorPos.x = (float)local_b8._0_4_;
    (local_f0->DC).CursorPos.y = (float)local_b8._4_4_;
    local_b8 = auVar17;
    if (pIVar33 != (ImGuiTabItem *)0x0) {
      local_100 = pIVar33->ID;
      tab_bar->SelectedTabId = local_100;
    }
  }
  local_a4[0] = 0;
  local_a4[1] = iVar31 + (int)fVar43;
  tab = (ImGuiWindow *)(ulong)(uint)local_a4[1];
  local_9c = fVar43;
  iVar31 = (tab_bar->Tabs).Size;
  iVar32 = (pIVar19->ShrinkWidthBuffer).Capacity;
  if (iVar32 < iVar31) {
    if (iVar32 == 0) {
      iVar41 = 8;
    }
    else {
      iVar41 = iVar32 / 2 + iVar32;
    }
    if (iVar41 <= iVar31) {
      iVar41 = iVar31;
    }
    if (iVar32 < iVar41) {
      tab = (ImGuiWindow *)MemAlloc((long)iVar41 << 3);
      pIVar6 = (pIVar19->ShrinkWidthBuffer).Data;
      if (pIVar6 != (ImGuiShrinkWidthItem *)0x0) {
        memcpy(tab,pIVar6,(long)(pIVar19->ShrinkWidthBuffer).Size << 3);
        MemFree((pIVar19->ShrinkWidthBuffer).Data);
      }
      (pIVar19->ShrinkWidthBuffer).Data = (ImGuiShrinkWidthItem *)tab;
      (pIVar19->ShrinkWidthBuffer).Capacity = iVar41;
    }
  }
  (pIVar19->ShrinkWidthBuffer).Size = iVar31;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_b8._8_8_;
  local_b8 = auVar17 << 0x40;
  if ((tab_bar->Tabs).Size < 1) {
    bVar21 = true;
    pIVar29 = (ImGuiWindow *)0x0;
  }
  else {
    lVar23 = 0;
    lVar40 = 0;
    bVar21 = false;
    pIVar29 = (ImGuiWindow *)0x0;
    iVar31 = -1;
    do {
      tab = (ImGuiWindow *)(tab_bar->Tabs).Data;
      if (*(int *)((long)&tab->FlagsPreviousFrame + lVar23) < tab_bar->PrevFrameVisible) {
        __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                      ,0x1bc9,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      pIVar28 = (ImGuiWindow *)((long)&tab->Name + lVar23);
      local_f0 = pIVar29;
      if (((pIVar29 == (ImGuiWindow *)0x0) ||
          ((int)(pIVar29->WindowClass).ClassId <
           *(int *)((long)&(tab->WindowClass).ClassId + lVar23))) &&
         ((*(byte *)((long)&tab->Name + lVar23 + 6) & 0x20) == 0)) {
        local_f0 = pIVar28;
      }
      IVar5 = *(ImGuiID *)&pIVar28->Name;
      if (IVar5 == tab_bar->SelectedTabId) {
        bVar21 = true;
      }
      if ((local_100 == 0) && (local_100 = IVar5, pIVar19->NavJustMovedToId != IVar5)) {
        local_100 = 0;
      }
      pcVar25 = ImGuiTabBar::GetTabName(tab_bar,(ImGuiTabItem *)pIVar28);
      IVar7 = TabItemCalcSize(pcVar25,(*(uint *)((long)&tab->Name + lVar23 + 4) >> 0x14 & 1) == 0);
      auVar17 = local_b8;
      fVar44 = IVar7.x;
      *(float *)((long)&(tab->WindowClass).ViewportFlagsOverrideClear + lVar23) = fVar44;
      uVar39 = *(uint *)((long)&tab->Name + lVar23 + 4);
      uVar37 = (ulong)(((char)uVar39 < '\0') + 1);
      if ((uVar39 & 0x40) != 0) {
        uVar37 = 0;
      }
      fVar42 = 0.0;
      if ((int)uVar37 == iVar31) {
        fVar42 = (pIVar19->Style).ItemInnerSpacing.x;
      }
      local_e8[uVar37 * 3 + 1] = fVar42 + fVar44 + local_e8[uVar37 * 3 + 1];
      iVar31 = local_a4[uVar37];
      lVar27 = (long)iVar31;
      local_a4[uVar37] = iVar31 + 1;
      if ((lVar27 < 0) || ((pIVar19->ShrinkWidthBuffer).Size <= iVar31)) goto LAB_002bc4dc;
      pIVar6 = (pIVar19->ShrinkWidthBuffer).Data;
      pIVar6[lVar27].Index = (int)lVar40;
      if ((pIVar19->ShrinkWidthBuffer).Size <= iVar31) goto LAB_002bc4dc;
      pIVar6[lVar27].Width = fVar44;
      if (fVar44 <= 0.0) {
        __assert_fail("tab->ContentWidth > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                      ,0x1be3,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      *(float *)((long)&(tab->WindowClass).ViewportFlagsOverrideSet + lVar23) = fVar44;
      lVar40 = lVar40 + 1;
      iVar32 = (tab_bar->Tabs).Size;
      lVar23 = lVar23 + 0x30;
      pIVar29 = local_f0;
      iVar31 = (int)uVar37;
    } while (lVar40 < iVar32);
    local_b8._1_7_ = 0;
    local_b8[0] = 1 < iVar32;
    local_b8._8_8_ = auVar17._8_8_;
    bVar21 = !bVar21;
  }
  tab_bar->WidthAllTabsIdeal = 0.0;
  fVar44 = 0.0;
  lVar23 = 8;
  do {
    fVar44 = fVar44 + *(float *)((long)&local_f0 + lVar23 + 4) + *(float *)((long)local_e8 + lVar23)
    ;
    lVar23 = lVar23 + 0xc;
  } while (lVar23 != 0x2c);
  tab_bar->WidthAllTabsIdeal = fVar44;
  pIVar18 = GImGui;
  if (((local_b8[0] & (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x < fVar44) != 0) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    tab = GImGui->CurrentWindow;
    fVar42 = GImGui->FontSize + -2.0;
    local_b8 = ZEXT416((uint)fVar42);
    fVar44 = (GImGui->Style).FramePadding.y;
    _local_98 = ZEXT416((uint)(fVar44 + fVar44 + GImGui->FontSize));
    local_68 = ZEXT416((uint)(fVar42 + fVar42));
    local_78 = (tab->DC).CursorPos;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar15 = (GImGui->Style).Colors[0].z;
    uVar16 = (GImGui->Style).Colors[0].w;
    local_58.w = (float)uVar16 * 0.5;
    local_58.z = (float)uVar15;
    pIVar24 = (ImGuiTabItem *)0x0;
    local_f0 = pIVar29;
    PushStyleColor(0,&local_58);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    local_70._0_4_ = (pIVar18->IO).KeyRepeatDelay;
    local_70._4_4_ = (pIVar18->IO).KeyRepeatRate;
    (pIVar18->IO).KeyRepeatDelay = 0.25;
    (pIVar18->IO).KeyRepeatRate = 0.2;
    fVar44 = (tab_bar->BarRect).Min.x;
    fVar42 = (tab_bar->BarRect).Max.x - (float)local_68._0_4_;
    uVar39 = -(uint)(fVar42 <= fVar44);
    fVar42 = (float)(uVar39 & (uint)fVar44 | ~uVar39 & (uint)fVar42);
    local_48 = ZEXT416((uint)fVar42);
    fVar44 = (tab_bar->BarRect).Min.y;
    (tab->DC).CursorPos.x = fVar42;
    (tab->DC).CursorPos.y = fVar44;
    uVar20 = local_98._0_4_;
    uStack_8c = local_98._4_4_;
    local_98._4_4_ = local_98._0_4_;
    local_98._0_4_ = local_b8._0_4_;
    uStack_90 = local_b8._4_4_;
    IVar7.y = (float)uVar20;
    IVar7.x = (float)local_b8._0_4_;
    bVar22 = ArrowButtonEx("##<",0,IVar7,0x410);
    iVar31 = -(uint)bVar22;
    fVar44 = (tab_bar->BarRect).Min.y;
    (tab->DC).CursorPos.x = (float)local_48._0_4_ + (float)local_b8._0_4_;
    (tab->DC).CursorPos.y = fVar44;
    pIVar33 = (ImGuiTabItem *)0x1;
    bVar22 = ArrowButtonEx("##>",1,(ImVec2)local_98,0x410);
    if (bVar22) {
      iVar31 = 1;
    }
    PopStyleColor(2);
    (pIVar18->IO).KeyRepeatDelay = (float)(undefined4)local_70;
    (pIVar18->IO).KeyRepeatRate = (float)local_70._4_4_;
    if (iVar31 != 0) {
      IVar5 = tab_bar->SelectedTabId;
      if (IVar5 == 0) {
LAB_002bbe14:
        pIVar33 = (ImGuiTabItem *)0x0;
      }
      else {
        uVar37 = (ulong)(tab_bar->Tabs).Size;
        bVar22 = 0 < (long)uVar37;
        if (0 < (long)uVar37) {
          pIVar33 = (tab_bar->Tabs).Data;
          bVar22 = true;
          if (pIVar33->ID != IVar5) {
            pIVar36 = pIVar33 + (uVar37 - 1);
            uVar35 = 0;
            pIVar24 = pIVar33;
            do {
              uVar30 = uVar37;
              pIVar33 = pIVar36;
              if (uVar37 - 1 == uVar35) break;
              pIVar33 = pIVar24 + 1;
              uVar30 = uVar35 + 1;
              pIVar1 = pIVar24 + 1;
              uVar35 = uVar30;
              pIVar24 = pIVar33;
            } while (pIVar1->ID != IVar5);
            bVar22 = uVar30 < uVar37;
          }
        }
        if (!bVar22) goto LAB_002bbe14;
      }
      if (pIVar33 == (ImGuiTabItem *)0x0) {
        pIVar24 = (ImGuiTabItem *)0x0;
      }
      else {
        uVar39 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar33);
        uVar26 = uVar39 + iVar31;
        iVar32 = (tab_bar->Tabs).Size;
        do {
          uVar34 = uVar39;
          if ((int)uVar26 < iVar32) {
            uVar34 = uVar26;
          }
          if ((int)uVar26 < 0) {
            uVar34 = uVar39;
          }
          if (((int)uVar34 < 0) || (iVar32 <= (int)uVar34)) goto LAB_002bc4bd;
          pIVar33 = (tab_bar->Tabs).Data;
          pIVar24 = pIVar33 + uVar34;
          if ((pIVar33[uVar34].Flags & 0x200000) != 0) {
            pIVar33 = pIVar24;
            if ((int)(uVar26 + iVar31) < iVar32) {
              pIVar33 = (ImGuiTabItem *)0x0;
            }
            uVar26 = uVar26 + iVar31;
            if (-1 < (int)uVar26) {
              pIVar24 = pIVar33;
            }
            uVar39 = uVar39 + iVar31;
          }
        } while (pIVar24 == (ImGuiTabItem *)0x0);
      }
    }
    (tab->DC).CursorPos = local_78;
    (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - ((float)local_68._0_4_ + 1.0);
    pIVar29 = local_f0;
    if ((pIVar24 != (ImGuiTabItem *)0x0) &&
       (local_100 = pIVar24->ID, (pIVar24->Flags & 0x200000) == 0)) {
      tab_bar->SelectedTabId = local_100;
    }
  }
  fVar44 = local_e8[1] + local_e8[2] + uStack_d0._4_4_ + local_c8;
  fVar42 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  if (fVar44 < fVar42) {
    fVar43 = (local_d8._4_4_ + (float)local_d8) -
             ((fVar42 - (local_e8[1] + local_e8[2])) - (uStack_d0._4_4_ + local_c8));
    fVar43 = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
  }
  else {
    fVar43 = fVar44 - fVar42;
  }
  if ((0.0 < fVar43) && ((fVar42 <= fVar44 || ((tab_bar->Flags & 0x40U) != 0)))) {
    uVar39 = (int)uStack_d0 + (int)local_e8[0];
    tab = (ImGuiWindow *)(ulong)uVar39;
    if (fVar42 <= fVar44) {
      tab = (ImGuiWindow *)0x0;
    }
    else {
      uVar39 = uStack_dc;
    }
    iVar31 = (int)tab;
    ShrinkWidths((pIVar19->ShrinkWidthBuffer).Data + iVar31,uVar39,fVar43);
    if (0 < (int)uVar39) {
      pIVar28 = tab;
      do {
        if ((iVar31 < 0) || ((pIVar19->ShrinkWidthBuffer).Size <= (int)pIVar28)) goto LAB_002bc4dc;
        pIVar6 = (pIVar19->ShrinkWidthBuffer).Data;
        iVar32 = pIVar6[(long)pIVar28].Index;
        lVar23 = (long)iVar32;
        if ((lVar23 < 0) || ((tab_bar->Tabs).Size <= iVar32)) goto LAB_002bc4bd;
        iVar32 = (int)pIVar6[(long)pIVar28].Width;
        if (-1 < iVar32) {
          fVar44 = (float)iVar32;
          pIVar33 = (tab_bar->Tabs).Data;
          lVar40 = (ulong)((char)pIVar33[lVar23].Flags < '\0') + 1;
          if ((pIVar33[lVar23].Flags & 0x40U) != 0) {
            lVar40 = 0;
          }
          local_e8[lVar40 * 3 + 1] = local_e8[lVar40 * 3 + 1] - (pIVar33[lVar23].Width - fVar44);
          pIVar33[lVar23].Width = fVar44;
        }
        pIVar28 = (ImGuiWindow *)((long)&pIVar28->Name + 1);
      } while ((int)pIVar28 < (int)(uVar39 + iVar31));
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  lVar23 = 0;
  fVar44 = 0.0;
  uVar39 = 0;
  do {
    fVar42 = fVar44;
    if ((lVar23 == 2) &&
       (fVar42 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_e8[7],
       fVar42 = (float)(~-(uint)(fVar42 <= 0.0) & (uint)fVar42), fVar44 <= fVar42)) {
      fVar42 = fVar44;
    }
    fVar43 = local_e8[lVar23 * 3];
    lVar40 = (long)(int)fVar43;
    if (0 < lVar40) {
      lVar27 = (ulong)uVar39 * 0x30;
      lVar38 = 0;
      do {
        if (((int)uVar39 < 0) || ((tab_bar->Tabs).Size <= (int)(uVar39 + (int)lVar38)))
        goto LAB_002bc4bd;
        pIVar33 = (tab_bar->Tabs).Data;
        *(float *)((long)&pIVar33->Offset + lVar27) = fVar42;
        *(undefined2 *)((long)&pIVar33->NameOffset + lVar27) = 0xffff;
        fVar44 = 0.0;
        if (lVar38 < lVar40 + -1) {
          fVar44 = (pIVar19->Style).ItemInnerSpacing.x;
        }
        fVar42 = fVar42 + fVar44 + *(float *)((long)&pIVar33->Width + lVar27);
        lVar38 = lVar38 + 1;
        lVar27 = lVar27 + 0x30;
      } while (lVar40 != lVar38);
    }
    fVar44 = local_e8[lVar23 * 3 + 2];
    fVar45 = local_e8[lVar23 * 3 + 1] + fVar44;
    tab_bar->WidthAllTabs = (float)(-(uint)(0.0 <= fVar45) & (uint)fVar45) + tab_bar->WidthAllTabs;
    fVar44 = fVar42 + fVar44;
    uVar39 = (int)fVar43 + uVar39;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  iVar31 = (tab_bar->TabsNames).Buf.Capacity;
  if (iVar31 < 0) {
    uVar39 = iVar31 / 2 + iVar31;
    tab = (ImGuiWindow *)0x0;
    if (0 < (int)uVar39) {
      tab = (ImGuiWindow *)(ulong)uVar39;
    }
    __dest = (char *)MemAlloc((size_t)tab);
    pcVar25 = (tab_bar->TabsNames).Buf.Data;
    if (pcVar25 != (char *)0x0) {
      memcpy(__dest,pcVar25,(long)(tab_bar->TabsNames).Buf.Size);
      MemFree((tab_bar->TabsNames).Buf.Data);
    }
    (tab_bar->TabsNames).Buf.Data = __dest;
    (tab_bar->TabsNames).Buf.Capacity = (int)tab;
  }
  (tab_bar->TabsNames).Buf.Size = 0;
  if (bVar21) {
    tab_bar->SelectedTabId = 0;
  }
  if (((tab_bar->SelectedTabId == 0) && (tab_bar->NextSelectedTabId == 0)) &&
     (pIVar29 != (ImGuiWindow *)0x0)) {
    local_100 = *(ImGuiID *)&pIVar29->Name;
    tab_bar->SelectedTabId = local_100;
  }
  tab_bar->VisibleTabId = tab_bar->SelectedTabId;
  tab_bar->VisibleTabWasSubmitted = false;
  pIVar29 = pIVar19->NavWindowingTarget;
  if (((pIVar29 != (ImGuiWindow *)0x0) && (pIVar29->DockNode != (ImGuiDockNode *)0x0)) &&
     (pIVar29->DockNode->TabBar == tab_bar)) {
    local_100 = pIVar29->ID;
    tab_bar->VisibleTabId = local_100;
  }
  if (local_100 != 0) {
    uVar37 = (ulong)(tab_bar->Tabs).Size;
    bVar21 = 0 < (long)uVar37;
    if (0 < (long)uVar37) {
      tab = (ImGuiWindow *)(tab_bar->Tabs).Data;
      bVar21 = true;
      if (*(ImGuiID *)&tab->Name != local_100) {
        pIVar28 = (ImGuiWindow *)((long)tab + uVar37 * 0x30 + -0x30);
        uVar35 = 1;
        pIVar29 = tab;
        do {
          uVar30 = uVar35;
          tab = pIVar28;
          if (uVar37 == uVar30) break;
          tab = (ImGuiWindow *)&pIVar29->Viewport;
          ppIVar2 = &pIVar29->Viewport;
          uVar35 = uVar30 + 1;
          pIVar29 = tab;
        } while (*(ImGuiID *)ppIVar2 != local_100);
        bVar21 = uVar30 < uVar37;
      }
    }
    if (((bVar21) && (tab != (ImGuiWindow *)0x0)) && (((ulong)tab->Name & 0xc000000000) == 0)) {
      local_f0 = (ImGuiWindow *)CONCAT44(local_f0._4_4_,GImGui->FontSize);
      iVar31 = ImGuiTabBar::GetTabOrder(tab_bar,(ImGuiTabItem *)tab);
      fVar42 = (float)(tab->WindowClass).ParentViewportId - local_e8[1];
      fVar44 = (float)local_f0;
      if (iVar31 < (int)local_e8[0]) {
        fVar44 = -0.0;
      }
      fVar44 = fVar42 - fVar44;
      fVar43 = (float)local_f0;
      if ((tab_bar->Tabs).Size - (int)uStack_d0 <= iVar31 + 1) {
        fVar43 = 1.0;
      }
      fVar43 = fVar42 + (float)(tab->WindowClass).ViewportFlagsOverrideSet + fVar43;
      fVar42 = ((((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_e8[1]) -
               uStack_d0._4_4_) - local_d8._4_4_;
      tab_bar->ScrollingTargetDistToVisibility = 0.0;
      if ((fVar44 < tab_bar->ScrollingTarget) || (fVar42 <= fVar43 - fVar44)) {
        fVar45 = tab_bar->ScrollingAnim - fVar43;
      }
      else {
        if (fVar43 - fVar42 <= tab_bar->ScrollingTarget) goto LAB_002bc322;
        fVar45 = (fVar44 - fVar42) - tab_bar->ScrollingAnim;
        fVar44 = fVar43 - fVar42;
      }
      tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar45) & (uint)fVar45);
      tab_bar->ScrollingTarget = fVar44;
    }
  }
LAB_002bc322:
  fVar44 = (tab_bar->BarRect).Min.x;
  fVar42 = (tab_bar->BarRect).Max.x;
  fVar45 = tab_bar->WidthAllTabs - (fVar42 - fVar44);
  fVar43 = tab_bar->ScrollingAnim;
  if (fVar45 <= tab_bar->ScrollingAnim) {
    fVar43 = fVar45;
  }
  fVar43 = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
  tab_bar->ScrollingAnim = fVar43;
  fVar46 = tab_bar->ScrollingTarget;
  if (fVar45 <= tab_bar->ScrollingTarget) {
    fVar46 = fVar45;
  }
  fVar46 = (float)(-(uint)(0.0 <= fVar46) & (uint)fVar46);
  tab_bar->ScrollingTarget = fVar46;
  if ((fVar43 != fVar46) || (NAN(fVar43) || NAN(fVar46))) {
    fVar45 = pIVar19->FontSize;
    fVar47 = fVar45 * 70.0;
    uVar39 = -(uint)(fVar47 <= tab_bar->ScrollingSpeed);
    fVar48 = ABS(fVar46 - fVar43) / 0.3;
    fVar47 = (float)(~uVar39 & (uint)fVar47 | (uint)tab_bar->ScrollingSpeed & uVar39);
    uVar39 = -(uint)(fVar48 <= fVar47);
    fVar48 = (float)(~uVar39 & (uint)fVar48 | uVar39 & (uint)fVar47);
    tab_bar->ScrollingSpeed = fVar48;
    fVar47 = fVar46;
    if ((pIVar19->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar45 * 10.0)) {
      fVar48 = fVar48 * (pIVar19->IO).DeltaTime;
      if (fVar46 <= fVar43) {
        fVar47 = fVar43;
        if (fVar46 < fVar43) {
          fVar43 = fVar43 - fVar48;
          uVar39 = -(uint)(fVar46 <= fVar43);
          fVar47 = (float)((uint)fVar43 & uVar39 | ~uVar39 & (uint)fVar46);
        }
      }
      else {
        fVar47 = fVar48 + fVar43;
        if (fVar46 <= fVar47) {
          fVar47 = fVar46;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar47;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  tab_bar->ScrollingRectMinX = fVar44 + local_e8[1] + local_e8[2];
  tab_bar->ScrollingRectMaxX = (fVar42 - uStack_d0._4_4_) - local_d8._4_4_;
  (pIVar19->CurrentWindow->DC).CursorPos = (tab_bar->BarRect).Min;
  local_58.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  local_58.x = tab_bar->WidthAllTabsIdeal;
  ItemSize((ImVec2 *)&local_58,(tab_bar->FramePadding).y);
  return;
LAB_002bc4dc:
  pcVar25 = "T &ImVector<ImGuiShrinkWidthItem>::operator[](int) [T = ImGuiShrinkWidthItem]";
  goto LAB_002bc4d2;
LAB_002bc4bd:
  pcVar25 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
LAB_002bc4d2:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.h"
                ,0x688,pcVar25);
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = (prev_tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (prev_tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_track_selected_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) == 0;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_track_selected_tab_id = scroll_track_selected_tab->ID;
            if (!(scroll_track_selected_tab->Flags & ImGuiTabItemFlags_Button))
                tab_bar->SelectedTabId = scroll_track_selected_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab->NameOffset = -1;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // Clear name buffers
    tab_bar->TabsNames.Buf.resize(0);

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // CTRL+TAB can override visible tab temporarily
    if (g.NavWindowingTarget != NULL && g.NavWindowingTarget->DockNode && g.NavWindowingTarget->DockNode->TabBar == tab_bar)
        tab_bar->VisibleTabId = scroll_track_selected_tab_id = g.NavWindowingTarget->ID;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabsIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
}